

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

int randomInt(int low,int high)

{
  initializer_list<unsigned_long> __il;
  result_type_conflict rVar1;
  uniform_int_distribution<int> local_13f4;
  uniform_int_distribution<int> dist;
  undefined1 local_13e0 [8];
  mt19937 mt;
  undefined1 local_40 [8];
  seed_seq seed;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  size_t local_18;
  unsigned_long s1;
  int high_local;
  int low_local;
  
  s1._0_4_ = high;
  s1._4_4_ = low;
  seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&seed._M_v.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  mt._M_p = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  __il._M_len = 1;
  __il._M_array = &mt._M_p;
  local_18 = mt._M_p;
  std::seed_seq::seed_seq<unsigned_long,void>((seed_seq *)local_40,__il);
  std::
  mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
  ::mersenne_twister_engine<std::seed_seq,void>
            ((mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
              *)local_13e0,(seed_seq *)local_40);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13f4,s1._4_4_,(int)s1);
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&local_13f4,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_13e0);
  std::seed_seq::~seed_seq((seed_seq *)local_40);
  return rVar1;
}

Assistant:

int randomInt(int low, int high) {
    auto s1 = static_cast<long unsigned int>(std::chrono::high_resolution_clock::now().time_since_epoch().count());
    std::seed_seq seed{s1};
    std::mt19937 mt(seed);
    std::uniform_int_distribution<int> dist(low, high);
    return dist(mt);
}